

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

bool __thiscall AActor::SuggestMissileAttack(AActor *this,double dist)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  
  if (((this->maxtargetrange <= 0.0) || (dist <= this->maxtargetrange)) &&
     ((this->MeleeState == (FState *)0x0 || (this->meleethreshold <= dist)))) {
    uVar2 = (this->flags4).Value;
    if ((uVar2 >> 10 & 1) != 0) {
      dist = dist * 0.5;
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      dist = dist * 0.125;
    }
    bVar1 = this->MinMissileChance;
    dVar5 = G_SkillProperty(SKILLP_Aggressiveness);
    iVar4 = (int)(dVar5 * (double)bVar1);
    iVar3 = FRandom::operator()(&pr_checkmissilerange);
    if ((int)dist < iVar4) {
      iVar4 = (int)dist;
    }
    return iVar4 <= iVar3;
  }
  return false;
}

Assistant:

bool AActor::SuggestMissileAttack (double dist)
{
	// new version encapsulates the different behavior in flags instead of virtual functions
	// The advantage is that this allows inheriting the missile attack attributes from the
	// various Doom monsters by custom monsters
	
	if (maxtargetrange > 0 && dist > maxtargetrange)
		return false;	// The Arch Vile's special behavior turned into a property
		
	if (MeleeState != NULL && dist < meleethreshold)
		return false;	// From the Revenant: close enough for fist attack

	if (flags4 & MF4_MISSILEMORE) dist *= 0.5;
	if (flags4 & MF4_MISSILEEVENMORE) dist *= 0.125;
	
	int mmc = int(MinMissileChance * G_SkillProperty(SKILLP_Aggressiveness));
	return pr_checkmissilerange() >= MIN<int> (int(dist), mmc);
}